

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseRAPass::blockEntryAssigned(BaseRAPass *this,PhysToWorkMap *physToWorkMap)

{
  byte *pbVar1;
  uint32_t *puVar2;
  RAWorkReg **ppRVar3;
  long in_RSI;
  BitWordIterator<unsigned_int> *in_RDI;
  RAWorkReg *workReg;
  uint32_t workId;
  uint32_t physId;
  BitWordIterator<unsigned_int> it;
  uint32_t physBaseIndex;
  RegGroup group;
  Iterator __end2;
  Iterator __begin2;
  RegGroupVirtValues *__range2;
  RAWorkReg *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  RegGroup group_00;
  uint32_t local_c0;
  uint32_t local_bc;
  uint local_b8;
  RegGroup local_b4;
  RegGroup local_b3;
  RegGroup local_b2;
  undefined1 local_b1;
  undefined1 *local_b0;
  long local_a8;
  undefined4 local_94;
  uint32_t *local_88;
  undefined1 *local_80;
  undefined1 local_71;
  undefined1 *local_70;
  undefined1 local_61;
  RegGroup *local_60;
  RegGroup *local_58;
  RegGroup *local_50;
  RegGroup *local_48;
  uint32_t local_3c;
  uint32_t *local_38;
  uint32_t *local_30;
  RAStrategy *local_28;
  uint local_1c;
  RAWorkReg *local_18;
  uint32_t *local_10;
  undefined1 local_2;
  RAStrategyType local_1;
  
  local_b0 = &local_b1;
  local_71 = 0;
  local_b2 = k0;
  local_61 = 4;
  local_b3 = kPC;
  local_a8 = in_RSI;
  local_80 = local_b0;
  local_70 = local_b0;
  while( true ) {
    local_58 = &local_b2;
    local_60 = &local_b3;
    if (local_b2 == local_b3) break;
    local_50 = &local_b2;
    local_b4 = local_b2;
    group_00 = local_b2;
    local_28 = Support::Array<asmjit::v1_14::RAStrategy,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                         ((Array<asmjit::v1_14::RAStrategy,_4UL> *)
                          CONCAT17(local_b2,in_stack_ffffffffffffff20),
                          (RegGroup *)in_stack_ffffffffffffff18);
    local_1 = local_28->_type;
    local_2 = 1;
    if (local_1 != kSimple) {
      pbVar1 = RARegCount::operator[]((RARegCount *)in_RDI,group_00);
      local_b8 = (uint)*pbVar1;
      puVar2 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                         ((RARegMask *)CONCAT17(group_00,in_stack_ffffffffffffff20),
                          (RegGroup *)in_stack_ffffffffffffff18);
      local_3c = *puVar2;
      local_38 = &local_bc;
      local_bc = local_3c;
      while (local_30 = &local_bc, local_bc != 0) {
        local_c0 = Support::BitWordIterator<unsigned_int>::next(in_RDI);
        local_94 = *(undefined4 *)(local_a8 + 0x20 + (ulong)(local_b8 + local_c0) * 4);
        ppRVar3 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                            ((ZoneVector<asmjit::v1_14::RAWorkReg_*> *)in_RDI,
                             CONCAT17(group_00,in_stack_ffffffffffffff20));
        in_stack_ffffffffffffff18 = *ppRVar3;
        local_88 = &local_c0;
        local_1c = 1 << ((byte)local_c0 & 0x1f);
        *(uint *)(in_stack_ffffffffffffff18 + 0x3c) =
             local_1c | *(uint *)(in_stack_ffffffffffffff18 + 0x3c);
        local_18 = in_stack_ffffffffffffff18;
        local_10 = local_88;
      }
    }
    local_48 = &local_b2;
    local_b2 = local_b2 + kVec;
  }
  return 0;
}

Assistant:

Error BaseRAPass::blockEntryAssigned(const PhysToWorkMap* physToWorkMap) noexcept {
  // Complex allocation strategy requires to record register assignments upon block entry (or per shared state).
  for (RegGroup group : RegGroupVirtValues{}) {
    if (!_strategy[group].isComplex())
      continue;

    uint32_t physBaseIndex = _physRegIndex[group];
    Support::BitWordIterator<RegMask> it(physToWorkMap->assigned[group]);

    while (it.hasNext()) {
      uint32_t physId = it.next();
      uint32_t workId = physToWorkMap->workIds[physBaseIndex + physId];

      RAWorkReg* workReg = workRegById(workId);
      workReg->addAllocatedMask(Support::bitMask(physId));
    }
  }

  return kErrorOk;
}